

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O0

void __thiscall
wavingz::demod::state_machine::sample_sm::lead_in_t::process
          (lead_in_t *this,sample_sm_t *ctx,optional<bool> *sample)

{
  optional<bool> *poVar1;
  bool bVar2;
  idle_t *this_00;
  reference_const_type pbVar3;
  size_t sVar4;
  preamble_t *this_01;
  unique_ptr<wavingz::demod::state_machine::sample_sm::preamble_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
  local_50;
  unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
  local_48;
  unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
  local_40;
  unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
  local_38 [2];
  undefined8 local_28;
  size_t LEAD_IN_SYMBOLS;
  optional<bool> *sample_local;
  sample_sm_t *ctx_local;
  lead_in_t *this_local;
  
  local_28 = 10;
  LEAD_IN_SYMBOLS = (size_t)sample;
  sample_local = (optional<bool> *)ctx;
  ctx_local = (sample_sm_t *)this;
  bVar2 = boost::operator==(sample);
  poVar1 = sample_local;
  if (bVar2) {
    this_00 = (idle_t *)operator_new(8);
    memset(this_00,0,8);
    idle_t::idle_t(this_00);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>>
    ::unique_ptr<std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>,void>
              ((unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>>
                *)&local_40,this_00);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>>
    ::
    unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>,void>
              ((unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>>
                *)local_38,&local_40);
    sample_sm_t::state((sample_sm_t *)poVar1,local_38);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ::~unique_ptr(local_38);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
    ::~unique_ptr(&local_40);
  }
  else {
    pbVar3 = boost::optional<bool>::operator*((optional<bool> *)LEAD_IN_SYMBOLS);
    poVar1 = sample_local;
    if (((*pbVar3 & 1U) != (this->last_sample & 1U)) &&
       (sVar4 = this->counter + 1, this->counter = sVar4, sVar4 == 10)) {
      this_01 = (preamble_t *)operator_new(0x20);
      pbVar3 = boost::optional<bool>::operator*((optional<bool> *)LEAD_IN_SYMBOLS);
      preamble_t::preamble_t(this_01,(bool)(*pbVar3 & 1));
      std::
      unique_ptr<wavingz::demod::state_machine::sample_sm::preamble_t,std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>>
      ::unique_ptr<std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>,void>
                ((unique_ptr<wavingz::demod::state_machine::sample_sm::preamble_t,std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>>
                  *)&local_50,this_01);
      std::
      unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>>
      ::
      unique_ptr<wavingz::demod::state_machine::sample_sm::preamble_t,std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>,void>
                ((unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>>
                  *)&local_48,&local_50);
      sample_sm_t::state((sample_sm_t *)poVar1,&local_48);
      std::
      unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      ::~unique_ptr(&local_48);
      std::
      unique_ptr<wavingz::demod::state_machine::sample_sm::preamble_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
      ::~unique_ptr(&local_50);
    }
    pbVar3 = boost::optional<bool>::operator*((optional<bool> *)LEAD_IN_SYMBOLS);
    this->last_sample = (bool)(*pbVar3 & 1);
  }
  return;
}

Assistant:

void
lead_in_t::process(sample_sm_t& ctx, const boost::optional<bool>& sample)
{
    const size_t LEAD_IN_SYMBOLS = 10;

    // On no signal, return to idle
    if (sample == boost::none)
    {
        ctx.state(std::unique_ptr<idle_t>(new idle_t()));
    }
    else
    {
        // skip the first few samples to synchronize
        if (*sample != last_sample)
        {
            if (++counter == LEAD_IN_SYMBOLS)
            {
                ctx.state(std::unique_ptr<preamble_t>(new preamble_t(*sample)));
            }
        }
        last_sample = *sample;
    }
}